

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int nni_msg_alloc(nni_msg **mp,size_t sz)

{
  int iVar1;
  int iVar2;
  nni_msg *ptr;
  ulong uVar3;
  size_t headwanted;
  size_t newsz;
  
  ptr = (nni_msg *)nni_zalloc(0xf8);
  if (ptr == (nni_msg *)0x0) {
    iVar1 = 2;
  }
  else {
    if ((sz < 0x400) ||
       (uVar3 = sz - (sz >> 1 & 0x5555555555555555),
       uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333),
       1 < (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
      newsz = sz + 0x20;
      headwanted = 0x20;
    }
    else {
      headwanted = 0;
      newsz = sz;
    }
    iVar1 = nni_chunk_grow(&ptr->m_body,newsz,headwanted);
    if (iVar1 == 0) {
      iVar1 = 0;
      iVar2 = nni_chunk_append(&ptr->m_body,(void *)0x0,sz);
      if (iVar2 != 0) {
        nni_panic("chunk_append failed");
      }
      nni_atomic_init(&ptr->m_refcnt);
      nni_atomic_set(&ptr->m_refcnt,1);
      *mp = ptr;
    }
    else {
      nni_free(ptr,0xf8);
    }
  }
  return iVar1;
}

Assistant:

int
nni_msg_alloc(nni_msg **mp, size_t sz)
{
	nni_msg *m;
	int      rv;

	if ((m = NNI_ALLOC_STRUCT(m)) == NULL) {
		return (NNG_ENOMEM);
	}

	// If the message is less than 1024 bytes, or is not power
	// of two aligned, then we insert a 32 bytes of headroom
	// to allow for inlining backtraces, etc.  We also allow the
	// amount of space at the end for the same reason.  Large aligned
	// allocations are unmolested to avoid excessive overallocation.
	if ((sz < 1024) || ((sz & (sz - 1)) != 0)) {
		rv = nni_chunk_grow(&m->m_body, sz + 32, 32);
	} else {
		rv = nni_chunk_grow(&m->m_body, sz, 0);
	}
	if (rv != 0) {
		NNI_FREE_STRUCT(m);
		return (rv);
	}
	if (nni_chunk_append(&m->m_body, NULL, sz) != 0) {
		// Should not happen since we just grew it to fit.
		nni_panic("chunk_append failed");
	}

	// We always start with a single valid reference count.
	nni_atomic_init(&m->m_refcnt);
	nni_atomic_set(&m->m_refcnt, 1);
	*mp = m;
	return (0);
}